

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O3

void SetSuperRound(TT_ExecContext exc,FT_F2Dot14 GridPeriod,FT_Long selector)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  switch((uint)((ulong)selector >> 6) & 3) {
  case 0:
    uVar1 = (ulong)((ushort)GridPeriod >> 1);
    uVar2 = (uint)((ulong)selector >> 4) & 3;
    uVar3 = (ulong)uVar2;
    switch(uVar2) {
    case 0:
      goto switchD_00173295_caseD_0;
    case 1:
      goto switchD_00173295_caseD_1;
    case 2:
switchD_00173295_caseD_2:
      uVar3 = uVar1 >> 9;
      goto switchD_00173295_caseD_0;
    case 3:
switchD_00173295_caseD_3:
      uVar2 = (int)uVar1 * 3;
    }
    goto LAB_001732c2;
  case 1:
    uVar1 = (ulong)(ushort)GridPeriod;
    uVar2 = (uint)((ulong)selector >> 4) & 3;
    uVar3 = (ulong)uVar2;
    switch(uVar2) {
    case 0:
      goto switchD_00173295_caseD_0;
    case 2:
      goto switchD_00173295_caseD_2;
    case 3:
      goto switchD_00173295_caseD_3;
    }
    break;
  case 2:
    uVar1 = (ulong)((uint)(ushort)GridPeriod * 2);
    uVar2 = (uint)((ulong)selector >> 4) & 3;
    uVar3 = (ulong)uVar2;
    switch(uVar2) {
    case 0:
      goto switchD_00173295_caseD_0;
    case 2:
      goto switchD_00173295_caseD_2;
    case 3:
      goto switchD_00173295_caseD_3;
    }
    break;
  case 3:
    uVar1 = (ulong)(ushort)GridPeriod;
    uVar2 = (uint)((ulong)selector >> 4) & 3;
    uVar3 = (ulong)uVar2;
    switch(uVar2) {
    case 0:
      goto switchD_00173295_caseD_0;
    case 2:
      goto switchD_00173295_caseD_2;
    case 3:
      goto switchD_00173295_caseD_3;
    }
  }
switchD_00173295_caseD_1:
  uVar2 = (uint)uVar1;
LAB_001732c2:
  uVar3 = (ulong)(uVar2 >> 10);
switchD_00173295_caseD_0:
  if ((selector & 0xfU) == 0) {
    lVar5 = uVar1 - 1;
  }
  else {
    iVar4 = ((int)(selector & 0xfU) + -4) * (uint)uVar1;
    iVar6 = iVar4 + 7;
    if (-1 < iVar4) {
      iVar6 = iVar4;
    }
    lVar5 = (long)(iVar6 >> 3);
  }
  exc->period = (ulong)((uint)uVar1 >> 8);
  exc->phase = uVar3;
  exc->threshold = lVar5 >> 8;
  return;
}

Assistant:

static void
  SetSuperRound( TT_ExecContext  exc,
                 FT_F2Dot14      GridPeriod,
                 FT_Long         selector )
  {
    switch ( (FT_Int)( selector & 0xC0 ) )
    {
      case 0:
        exc->period = GridPeriod / 2;
        break;

      case 0x40:
        exc->period = GridPeriod;
        break;

      case 0x80:
        exc->period = GridPeriod * 2;
        break;

      /* This opcode is reserved, but... */
      case 0xC0:
        exc->period = GridPeriod;
        break;
    }

    switch ( (FT_Int)( selector & 0x30 ) )
    {
    case 0:
      exc->phase = 0;
      break;

    case 0x10:
      exc->phase = exc->period / 4;
      break;

    case 0x20:
      exc->phase = exc->period / 2;
      break;

    case 0x30:
      exc->phase = exc->period * 3 / 4;
      break;
    }

    if ( ( selector & 0x0F ) == 0 )
      exc->threshold = exc->period - 1;
    else
      exc->threshold = ( (FT_Int)( selector & 0x0F ) - 4 ) * exc->period / 8;

    /* convert to F26Dot6 format */
    exc->period    >>= 8;
    exc->phase     >>= 8;
    exc->threshold >>= 8;
  }